

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singly_linked_list.cpp
# Opt level: O2

void __thiscall si9ma::SinglyLinkedList::reverse_list(SinglyLinkedList *this)

{
  SinglyNodeWithRand *pSVar1;
  SinglyNodeWithRand *pSVar2;
  SinglyNodeWithRand *pSVar3;
  SinglyNodeWithRand *pSVar4;
  
  if (1 < this->size) {
    pSVar1 = this->head;
    pSVar3 = pSVar1;
    pSVar4 = pSVar1->next;
    while (pSVar4 != (SinglyNodeWithRand *)0x0) {
      pSVar2 = pSVar4->next;
      pSVar4->next = pSVar3;
      pSVar3 = pSVar4;
      pSVar4 = pSVar2;
    }
    pSVar1->next = (SinglyNodeWithRand *)0x0;
    this->head = this->tail;
  }
  return;
}

Assistant:

void SinglyLinkedList::reverse_list() {
        if (size < 2)
            return;

        SinglyNodeWithRand *prev = head;
        SinglyNodeWithRand *cur = head->next;
        SinglyNodeWithRand *next = head->next->next;

        while (cur){
            next = cur->next;
            cur->next = prev;
            prev = cur;
            cur = next;
        }

        head->next = nullptr;
        SinglyNodeWithRand *ptr = head;
        head = tail;
        tail = head;
    }